

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O2

void __thiscall
robin_hood::detail::
Table<true,_80UL,_int,_std::unique_ptr<Rml::FontFaceHandleDefault,_std::default_delete<Rml::FontFaceHandleDefault>_>,_robin_hood::hash<int,_void>,_std::equal_to<int>_>
::clear(Table<true,_80UL,_int,_std::unique_ptr<Rml::FontFaceHandleDefault,_std::default_delete<Rml::FontFaceHandleDefault>_>,_robin_hood::hash<int,_void>,_std::equal_to<int>_>
        *this)

{
  ulong uVar1;
  ulong uVar2;
  size_t __n;
  uint8_t *__s;
  ulong uVar3;
  Destroyer<robin_hood::detail::Table<true,_80UL,_int,_std::unique_ptr<Rml::FontFaceHandleDefault,_std::default_delete<Rml::FontFaceHandleDefault>_>,_robin_hood::hash<int,_void>,_std::equal_to<int>_>,_false>
  local_11;
  
  if (this->mNumElements != 0) {
    Destroyer<robin_hood::detail::Table<true,_80UL,_int,_std::unique_ptr<Rml::FontFaceHandleDefault,_std::default_delete<Rml::FontFaceHandleDefault>_>,_robin_hood::hash<int,_void>,_std::equal_to<int>_>,_false>
    ::nodes(&local_11,this);
    uVar2 = this->mMask + 1;
    if (uVar2 < 0x28f5c28f5c28f5d) {
      uVar1 = (uVar2 * 0x50) / 100;
    }
    else {
      uVar1 = (uVar2 / 100) * 0x50;
    }
    uVar3 = 0xff;
    if (uVar1 < 0xff) {
      uVar3 = uVar1;
    }
    __s = this->mInfo;
    __n = uVar3 + uVar2 + 8;
    if (__n != 0) {
      memset(__s,0,__n);
      __s = this->mInfo;
    }
    __s[uVar3 + uVar2] = '\x01';
    this->mInfoInc = 0x20;
    this->mInfoHashShift = 0;
  }
  return;
}

Assistant:

bool empty() const noexcept {
        ROBIN_HOOD_TRACE(this)
        return 0 == mNumElements;
    }